

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O1

stumpless_entry *
vstumpless_set_entry_message(stumpless_entry *entry,char *message,__va_list_tag *subs)

{
  char *__ptr;
  char *pcVar1;
  size_t message_length;
  size_t local_20;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
LAB_0010c78d:
    entry = (stumpless_entry *)0x0;
  }
  else {
    if (message == (char *)0x0) {
      local_20 = 0;
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = no_vsnprintf_s_format_string(message,subs,&local_20);
      if (pcVar1 == (char *)0x0) goto LAB_0010c78d;
    }
    pthread_lock_mutex((pthread_mutex_t *)entry->mutex);
    __ptr = entry->message;
    entry->message = pcVar1;
    entry->message_length = local_20;
    pthread_unlock_mutex((pthread_mutex_t *)entry->mutex);
    free_mem(__ptr);
    clear_error();
  }
  return entry;
}

Assistant:

struct stumpless_entry *
vstumpless_set_entry_message( struct stumpless_entry *entry,
                              const char *message,
                              va_list subs ) {
  const char *old_message;
  char *new_message;
  size_t message_length;

  VALIDATE_ARG_NOT_NULL( entry );

  if( !message ) {
    new_message = NULL;
    message_length = 0;

  } else {
    new_message = config_format_string( message, subs, &message_length );
    if( !new_message ) {
      return NULL;
    }
  }

  lock_entry( entry );
  old_message = entry->message;
  entry->message = new_message;
  entry->message_length = message_length;
  unlock_entry( entry );

  free_mem( old_message );
  clear_error(  );
  return entry;
}